

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxPow::Emit(FxPow *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  uint uVar2;
  ExpEmit EVar3;
  ExpEmit EVar4;
  int opcode;
  ExpEmit EVar5;
  ExpEmit op2;
  ExpEmit op1;
  uint extraout_var;
  uint extraout_var_00;
  
  EVar3._0_4_ = (*((this->super_FxBinary).left)->_vptr_FxExpression[9])();
  EVar3.Konst = (bool)(char)extraout_var;
  EVar3.Fixed = (bool)(char)(extraout_var >> 8);
  EVar3.Final = (bool)(char)(extraout_var >> 0x10);
  EVar3.Target = (bool)(char)(extraout_var >> 0x18);
  pFVar1 = (this->super_FxBinary).right;
  op1 = EVar3;
  EVar4._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  EVar4.Konst = (bool)(char)extraout_var_00;
  EVar4.Fixed = (bool)(char)(extraout_var_00 >> 8);
  EVar4.Final = (bool)(char)(extraout_var_00 >> 0x10);
  EVar4.Target = (bool)(char)(extraout_var_00 >> 0x18);
  op2 = EVar4;
  if (((extraout_var & 1) != 0) && ((extraout_var_00 & 1) != 0)) {
    __assert_fail("!op1.Konst || !op2.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xc10,"virtual ExpEmit FxPow::Emit(VMFunctionBuilder *)");
  }
  ExpEmit::Free(&op1,build);
  ExpEmit::Free(&op2,build);
  if (((EVar3._0_4_ & 0xff0000) == 0x10000) && ((EVar4._0_4_ & 0xff0000) == 0x10000)) {
    uVar2 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 1,1);
    opcode = 0xa6;
    if ((extraout_var & 1) == 0) {
      opcode = 0xa5 - (uint)((extraout_var_00 & 1) == 0);
    }
    VMFunctionBuilder::Emit(build,opcode,uVar2 & 0xffff,EVar3._0_4_ & 0xffff,EVar4._0_4_ & 0xffff);
    EVar5._0_4_ = uVar2 & 0xffff | 0x1010000;
    EVar5.Konst = false;
    EVar5.Fixed = false;
    EVar5.Final = false;
    EVar5.Target = false;
    return EVar5;
  }
  __assert_fail("op1.RegType == REGT_FLOAT && op2.RegType == REGT_FLOAT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0xc13,"virtual ExpEmit FxPow::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxPow::Emit(VMFunctionBuilder *build)
{
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);

	// Pow is not commutative, so either side may be constant (but not both).
	assert(!op1.Konst || !op2.Konst);
	op1.Free(build);
	op2.Free(build);
	assert(op1.RegType == REGT_FLOAT && op2.RegType == REGT_FLOAT);
	ExpEmit to(build, REGT_FLOAT);
	build->Emit((op1.Konst ? OP_POWF_KR : op2.Konst ? OP_POWF_RK : OP_POWF_RR),	to.RegNum, op1.RegNum, op2.RegNum);
	return to;
}